

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_fe.h
# Opt level: O0

Matrix<double,_1,__1,_1,_1,__1> __thiscall
lf::fe::FeHierarchicSegment<double>::NodalValuesToDofs
          (FeHierarchicSegment<double> *this,Matrix<double,_1,__1,_1,_1,__1> *nodevals)

{
  int iVar1;
  Index IVar2;
  uint uVar3;
  DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0> *this_00;
  size_type sVar4;
  CoeffReturnType pdVar5;
  Scalar *pSVar6;
  DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this_01;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_02;
  DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0> *in_RDX;
  Index extraout_RDX;
  double dVar7;
  double dVar8;
  CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:379:15),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  CVar9;
  Matrix<double,_1,__1,_1,_1,__1> MVar10;
  Type local_178;
  ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>
  local_140;
  NestedExpressionType local_108;
  non_const_type local_100;
  NestedExpressionType local_f8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
  local_f0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>_>
  local_d8;
  Scalar local_78;
  double integ;
  CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:379:15),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_68;
  undefined1 local_58 [8];
  Matrix<double,_1,__1,_1,_1,__1> psidd;
  double P1;
  double P0;
  size_type i;
  size_type local_28;
  undefined1 local_21;
  DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0> *local_20;
  Matrix<double,_1,__1,_1,_1,__1> *nodevals_local;
  FeHierarchicSegment<double> *this_local;
  Matrix<double,_1,__1,_1,_1,__1> *dofs;
  
  local_21 = 0;
  local_20 = in_RDX;
  nodevals_local = nodevals;
  this_local = this;
  local_28 = NumRefShapeFunctions((FeHierarchicSegment<double> *)nodevals);
  Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::Matrix<unsigned_int>
            ((Matrix<double,_1,__1,_1,_1,__1> *)this,&local_28);
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[](local_20,0)
  ;
  dVar8 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)this,0);
  *pSVar6 = dVar8;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[](local_20,1)
  ;
  dVar8 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)this,1);
  *pSVar6 = dVar8;
  P0._0_4_ = 2;
  while( true ) {
    uVar3 = P0._0_4_;
    sVar4 = NumRefShapeFunctions((FeHierarchicSegment<double> *)nodevals);
    if (sVar4 <= uVar3) break;
    dVar7 = ILegendreDx(P0._0_4_,0.0,1.0);
    psidd.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols =
         (Index)ILegendreDx(P0._0_4_,1.0,1.0);
    this_01 = (DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
              quad::QuadRule::Points
                        ((QuadRule *)
                         nodevals[1].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                         m_storage.m_data);
    integ = (double)&P0;
    CVar9 = Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
            unaryExpr<lf::fe::FeHierarchicSegment<double>::NodalValuesToDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_1_>
                      (this_01,(anon_class_8_1_54a39809_for_op *)&integ);
    local_68 = CVar9;
    Eigen::Matrix<double,1,-1,1,1,-1>::
    Matrix<Eigen::CwiseUnaryOp<lf::fe::FeHierarchicSegment<double>::NodalValuesToDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_1_,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
              ((Matrix<double,1,_1,1,1,_1> *)local_58,
               (EigenBase<Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:379:15),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)&local_68);
    this_02 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
              quad::QuadRule::Weights
                        ((QuadRule *)
                         nodevals[1].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                         m_storage.m_data);
    local_100 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose(this_02);
    local_f8.m_matrix =
         (non_const_type)
         Eigen::MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>::array
                   ((MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
                    &local_100);
    local_108 = (NestedExpressionType)
                Eigen::MatrixBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::array
                          ((MatrixBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)local_58);
    Eigen::
    ArrayBase<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>const>const>>::
    operator*(&local_f0,
              (ArrayBase<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
               *)&local_f8,
              (ArrayBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_> *)
              &local_108);
    this_00 = local_20;
    sVar4 = quad::QuadRule::NumPoints
                      ((QuadRule *)
                       nodevals[1].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                       m_storage.m_data);
    Eigen::DenseBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::tail<unsigned_int>
              (&local_178,(DenseBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)this_00,sVar4);
    Eigen::MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>_>::
    array(&local_140,
          (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_> *)
          &local_178);
    Eigen::
    ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,-1,1,1,-1>const>const>>
    ::operator*(&local_d8,
                (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,_1,1,1,_1>const>const>>
                 *)&local_f0,
                (ArrayBase<Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>_>
                 *)&local_140);
    local_78 = Eigen::
               DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>_>_>_>
               ::sum((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>_>_>
                      *)&local_d8);
    IVar2 = psidd.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                       (local_20,1);
    dVar8 = *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                       (local_20,0);
    dVar8 = ((double)IVar2 * dVar8 - dVar7 * *pdVar5) - local_78;
    iVar1 = P0._0_4_ * 2;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)this,
                        (ulong)P0._0_4_);
    *pSVar6 = dVar8 * (double)(iVar1 - 1);
    Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::~Matrix((Matrix<double,_1,__1,_1,_1,__1> *)local_58);
    P0._0_4_ = P0._0_4_ + 1;
  }
  MVar10.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols =
       extraout_RDX;
  MVar10.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data =
       (double *)this;
  return (Matrix<double,_1,__1,_1,_1,__1>)
         MVar10.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage;
}

Assistant:

[[nodiscard]] Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> NodalValuesToDofs(
      const Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> &nodevals) const override {
    Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> dofs(NumRefShapeFunctions());
    // Compute the first and second basis function coefficients
    dofs[0] = nodevals[0];
    dofs[1] = nodevals[1];
    // Compute the other basis function coefficients
    for (lf::base::size_type i = 2; i < NumRefShapeFunctions(); ++i) {
      const SCALAR P0 = ILegendreDx(i, 0);
      const SCALAR P1 = ILegendreDx(i, 1);
      const Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> psidd =
          qr_dual_->Points().unaryExpr(
              [&](double x) -> SCALAR { return LegendreDx(i - 1, x); });
      // Evaluate the integral from the dual basis
      const SCALAR integ =
          (qr_dual_->Weights().transpose().array() * psidd.array() *
           nodevals.tail(qr_dual_->NumPoints()).array())
              .sum();
      // Compute the basis function coefficient
      dofs[i] = (P1 * nodevals[1] - P0 * nodevals[0] - integ) * (2 * i - 1);
    }
    return dofs;
  }